

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_struct_reader
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  bool bVar1;
  int32_t iVar2;
  members_type *this_00;
  ostream *poVar3;
  reference pptVar4;
  t_type *type;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_148
  ;
  t_field **local_140;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  string id;
  string local_e8;
  undefined1 local_c8 [8];
  string t;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  string str;
  string sname;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  this_00 = t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)((long)&sname.field_2 + 8));
  type_name_abi_cxx11_((string *)((long)&str.field_2 + 8),this,&tstruct->super_t_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"_str",&local_91);
  t_generator::tmp((string *)local_70,(t_generator *)this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"_t",(allocator *)(id.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_c8,(t_generator *)this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(id.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"_id",&local_131);
  t_generator::tmp((string *)local_110,(t_generator *)this,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"let rec read_");
  poVar3 = std::operator<<(poVar3,(string *)(str.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," (iprot : Protocol.t) =");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"let ");
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = std::operator<<(poVar3," = new ");
  poVar3 = std::operator<<(poVar3,(string *)(str.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," in");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"ignore(iprot#readStructBegin);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"(try while true do");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"let (_,");
  poVar3 = std::operator<<(poVar3,(string *)local_c8);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,(string *)local_110);
  poVar3 = std::operator<<(poVar3,") = iprot#readFieldBegin in");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"if ");
  poVar3 = std::operator<<(poVar3,(string *)local_c8);
  poVar3 = std::operator<<(poVar3," = Protocol.T_STOP then");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"raise Break");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"else ();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"(match ");
  poVar3 = std::operator<<(poVar3,(string *)local_110);
  poVar3 = std::operator<<(poVar3," with ");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  local_140 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  sname.field_2._8_8_ = local_140;
  while( true ) {
    local_148._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&sname.field_2 + 8),&local_148);
    if (!bVar1) break;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"| ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&sname.field_2 + 8));
    iVar2 = t_field::get_key(*pptVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," -> (");
    poVar3 = std::operator<<(out,"if ");
    poVar3 = std::operator<<(poVar3,(string *)local_c8);
    poVar3 = std::operator<<(poVar3," = ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&sname.field_2 + 8));
    type = t_field::get_type(*pptVar4);
    type_to_enum_abi_cxx11_(&local_168,this,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_168);
    poVar3 = std::operator<<(poVar3," then");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_up((t_generator *)this);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)((long)&sname.field_2 + 8));
    tfield = *pptVar4;
    std::__cxx11::string::string((string *)&local_188,(string *)local_70);
    generate_deserialize_field(this,out,tfield,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1a8,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&local_1a8);
    poVar3 = std::operator<<(poVar3,"else");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1c8);
    poVar3 = std::operator<<(poVar3,"  iprot#skip ");
    poVar3 = std::operator<<(poVar3,(string *)local_c8);
    poVar3 = std::operator<<(poVar3,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)((long)&sname.field_2 + 8));
  }
  t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&local_1e8);
  poVar3 = std::operator<<(poVar3,"| _ -> ");
  poVar3 = std::operator<<(poVar3,"iprot#skip ");
  poVar3 = std::operator<<(poVar3,(string *)local_c8);
  poVar3 = std::operator<<(poVar3,");");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e8);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"iprot#readFieldEnd;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"done; ()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"with Break -> ());");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"iprot#readStructEnd;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  string sname = type_name(tstruct);
  string str = tmp("_str");
  string t = tmp("_t");
  string id = tmp("_id");
  indent(out) << "let rec read_" << sname << " (iprot : Protocol.t) =" << endl;
  indent_up();
  indent(out) << "let " << str << " = new " << sname << " in" << endl;
  indent_up();
  indent(out) << "ignore(iprot#readStructBegin);" << endl;

  // Loop over reading in fields
  indent(out) << "(try while true do" << endl;
  indent_up();
  indent_up();

  // Read beginning field marker
  indent(out) << "let (_," << t << "," << id << ") = iprot#readFieldBegin in" << endl;

  // Check for field STOP marker and break
  indent(out) << "if " << t << " = Protocol.T_STOP then" << endl;
  indent_up();
  indent(out) << "raise Break" << endl;
  indent_down();
  indent(out) << "else ();" << endl;

  indent(out) << "(match " << id << " with " << endl;
  indent_up();
  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "| " << (*f_iter)->get_key() << " -> (";
    out << "if " << t << " = " << type_to_enum((*f_iter)->get_type()) << " then" << endl;
    indent_up();
    indent_up();
    generate_deserialize_field(out, *f_iter, str);
    indent_down();
    out << indent() << "else" << endl << indent() << "  iprot#skip " << t << ")" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "| _ -> "
      << "iprot#skip " << t << ");" << endl;
  indent_down();
  // Read field end marker
  indent(out) << "iprot#readFieldEnd;" << endl;
  indent_down();
  indent(out) << "done; ()" << endl;
  indent_down();
  indent(out) << "with Break -> ());" << endl;

  indent(out) << "iprot#readStructEnd;" << endl;

  indent(out) << str << endl << endl;
  indent_down();
  indent_down();
}